

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_163::ConstantGlobalApplier::visitFunction
          (ConstantGlobalApplier *this,Function *curr)

{
  Function *func;
  Module *module;
  PassRunner *runner_00;
  undefined1 local_280 [8];
  PassRunner runner;
  ReFinalize local_180;
  Function *local_18;
  Function *curr_local;
  ConstantGlobalApplier *this_local;
  
  if ((this->replaced & 1U) != 0) {
    local_18 = curr;
    curr_local = (Function *)this;
    if ((this->refinalize & 1U) != 0) {
      ReFinalize::ReFinalize(&local_180);
      func = local_18;
      module = Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::getModule((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                            *)&this->field_0x58);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_180.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 func,module);
      ReFinalize::~ReFinalize(&local_180);
    }
    if ((this->optimize & 1U) != 0) {
      runner_00 = Pass::getPassRunner((Pass *)this);
      PassRunner::PassRunner((PassRunner *)local_280,runner_00);
      PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_280);
      PassRunner::runOnFunction((PassRunner *)local_280,local_18);
      PassRunner::~PassRunner((PassRunner *)local_280);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    if (replaced) {
      if (refinalize) {
        ReFinalize().walkFunctionInModule(curr, this->getModule());
      }
      if (optimize) {
        PassRunner runner(getPassRunner());
        runner.addDefaultFunctionOptimizationPasses();
        runner.runOnFunction(curr);
      }
    }
  }